

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Articulated_Parts_PDU::Articulated_Parts_PDU
          (Articulated_Parts_PDU *this,LE_EntityIdentifier *ID)

{
  LE_EntityIdentifier *ID_local;
  Articulated_Parts_PDU *this_local;
  
  LE_Header::LE_Header(&this->super_LE_Header);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Articulated_Parts_PDU_0032db20;
  this->m_ui8NumOfVariableParams = '\0';
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters);
  DATA_TYPE::LE_EntityIdentifier::operator=(&(this->super_LE_Header).m_EntID,ID);
  (this->super_LE_Header).super_Header.super_Header6.m_ui8PDUType = '0';
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = 0x11;
  return;
}

Assistant:

Articulated_Parts_PDU::Articulated_Parts_PDU( const LE_EntityIdentifier & ID ) :
    m_ui8NumOfVariableParams( 0 )
{
    m_EntID = ID;
    m_ui8PDUType = ArticulatedParts_PDU_Type;
    m_ui16PDULength = ARTICULATED_PARTS_PDU_SIZE;
}